

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_15::parseFlag(int argc,char **argv,char *pattern)

{
  bool bVar1;
  String local_38;
  char *local_20;
  char *pattern_local;
  char **argv_local;
  int argc_local;
  
  local_20 = pattern;
  pattern_local = (char *)argv;
  argv_local._4_4_ = argc;
  String::String(&local_38);
  bVar1 = parseOption(argc,argv,pattern,(String *)0x0,&local_38);
  String::~String(&local_38);
  return bVar1;
}

Assistant:

bool parseFlag(int argc, const char* const* argv, const char* pattern) {
        return parseOption(argc, argv, pattern);
    }